

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

string * __thiscall
VectorInstance::op_replaceAll_with
          (string *__return_storage_ptr__,VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  string *value;
  pointer psVar1;
  bool bVar2;
  undefined8 *puVar3;
  string *type;
  long lVar4;
  int i;
  long lVar5;
  shared_ptr<Instance> instance;
  undefined1 local_50 [16];
  shared_ptr<Instance> temporary;
  
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start == 0x40) {
    value = &this->_element_type;
    get_shared_instance((string *)&instance,value);
    type = (string *)&temporary;
    get_shared_instance(type,value);
    lVar4 = 0;
    for (lVar5 = 0;
        psVar1 = (this->_value).
                 super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        lVar5 < (int)((ulong)((long)(this->_value).
                                    super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1) >> 4)
        ; lVar5 = lVar5 + 1) {
      bVar2 = InstanceIsEqualToComparator::operator()
                        ((InstanceIsEqualToComparator *)type,
                         (shared_ptr<Instance> *)
                         ((long)&(psVar1->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr + lVar4),&instance);
      if (bVar2) {
        get_shared_instance((string *)local_50,value);
        std::__shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&(((this->_value).
                             super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + lVar4)
                   ,(__shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2> *)local_50);
        type = (string *)(local_50 + 8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)type);
      }
      lVar4 = lVar4 + 0x10;
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,"null",(allocator *)local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&temporary.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&instance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return __return_storage_ptr__;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "RuntimeError: wrong number of arguments.";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

std::string VectorInstance::op_replaceAll_with(const std::vector<std::string>& arguments) {
    if (arguments.size() != 2)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    std::shared_ptr<Instance> instance = get_shared_instance(_element_type, arguments[0]);
    std::shared_ptr<Instance> temporary = get_shared_instance(_element_type, arguments[1]);
    for (int i = 0; i < int(_value.size()); i++)
        if (InstanceIsEqualToComparator()(_value[i], instance))
            _value[i] = get_shared_instance(_element_type, arguments[1]);
    return "null";
}